

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curl_sasl.c
# Opt level: O3

CURLcode Curl_sasl_decode_cram_md5_message(char *chlg64,char **outptr,size_t *outlen)

{
  char cVar1;
  uchar uVar2;
  CURLcode CVar3;
  size_t sVar4;
  uchar *puVar5;
  long lVar6;
  char *pcVar7;
  ulong uVar8;
  long lVar9;
  long lVar10;
  long lVar11;
  char cVar12;
  ulong uVar13;
  uchar *puVar14;
  size_t sVar15;
  
  cVar1 = *chlg64;
  *outptr = (char *)0x0;
  *outlen = 0;
  if ((cVar1 == '\0') || (*chlg64 == '=')) {
    return CURLE_OK;
  }
  *outptr = (char *)0x0;
  *outlen = 0;
  sVar4 = strlen(chlg64);
  CVar3 = CURLE_BAD_CONTENT_ENCODING;
  if ((sVar4 & 3) == 0 && sVar4 != 0) {
    for (lVar10 = 0; chlg64[lVar10] != '\0'; lVar10 = lVar10 + 1) {
      if (chlg64[lVar10] == '=') {
        lVar6 = (ulong)(chlg64[lVar10 + 1] == '=') + 1;
        goto LAB_004d0a2c;
      }
    }
    lVar6 = 0;
LAB_004d0a2c:
    if (sVar4 - lVar6 == lVar10) {
      uVar13 = sVar4 >> 2;
      sVar15 = uVar13 * 3 - lVar6;
      puVar5 = (uchar *)(*Curl_cmalloc)(sVar15 + 1);
      if (puVar5 == (uchar *)0x0) {
        CVar3 = CURLE_OUT_OF_MEMORY;
      }
      else {
        lVar10 = 0;
        puVar14 = puVar5;
        do {
          uVar8 = 0;
          lVar6 = 0;
          lVar9 = 0;
          pcVar7 = chlg64;
          do {
            cVar1 = *pcVar7;
            if (cVar1 == '=') {
              uVar8 = uVar8 << 6;
              lVar9 = lVar9 + 1;
            }
            else {
              lVar11 = 0;
              if (cVar1 == 'A') {
                cVar12 = 'A';
              }
              else {
                do {
                  cVar12 = "ABCDEFGHIJKLMNOPQRSTUVWXYZabcdefghijklmnopqrstuvwxyz0123456789+/"
                           [lVar11 + 1];
                  lVar11 = lVar11 + 1;
                  if (cVar12 == '\0') break;
                } while (cVar12 != cVar1);
              }
              if (cVar12 != cVar1) goto LAB_004d0b57;
              uVar8 = uVar8 * 0x40 + lVar11;
            }
            lVar6 = lVar6 + 1;
            pcVar7 = pcVar7 + 1;
          } while (lVar6 != 4);
          if (lVar9 == 1) {
LAB_004d0afa:
            uVar2 = curlx_ultouc(uVar8 >> 8 & 0xff);
            puVar14[1] = uVar2;
          }
          else if (lVar9 == 0) {
            uVar2 = curlx_ultouc(uVar8 & 0xff);
            puVar14[2] = uVar2;
            goto LAB_004d0afa;
          }
          uVar2 = curlx_ultouc(uVar8 >> 0x10 & 0xff);
          *puVar14 = uVar2;
          if (lVar9 == 3) {
LAB_004d0b57:
            (*Curl_cfree)(puVar5);
            return CURLE_BAD_CONTENT_ENCODING;
          }
          puVar14 = puVar14 + (3 - lVar9);
          chlg64 = chlg64 + 4;
          lVar10 = lVar10 + 1;
        } while (lVar10 != uVar13 + (uVar13 == 0));
        *puVar14 = '\0';
        *outptr = (char *)puVar5;
        *outlen = sVar15;
        CVar3 = CURLE_OK;
      }
    }
  }
  return CVar3;
}

Assistant:

CURLcode Curl_sasl_decode_cram_md5_message(const char *chlg64, char **outptr,
                                           size_t *outlen)
{
  CURLcode result = CURLE_OK;
  size_t chlg64len = strlen(chlg64);

  *outptr = NULL;
  *outlen = 0;

  /* Decode the challenge if necessary */
  if(chlg64len && *chlg64 != '=')
    result = Curl_base64_decode(chlg64, (unsigned char **) outptr, outlen);

    return result;
 }